

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,QSizeF *size,Unit units)

{
  Unit in_ECX;
  QSizeF *in_RDX;
  long *in_RSI;
  QPlatformPrintDevice *in_RDI;
  long in_FS_OFFSET;
  QPlatformPrintDevice *this_00;
  undefined1 local_28 [24];
  QPageSize local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if ((*(byte *)((long)in_RSI + 0x6b) & 1) == 0) {
    (**(code **)(*in_RSI + 0x130))();
  }
  QString::QString((QString *)0x13253b);
  QPageSize::QPageSize(local_10,in_RDX,in_ECX,(QString *)local_28,FuzzyMatch);
  supportedPageSizeMatch(this_00,(QPageSize *)in_RDI);
  QPageSize::~QPageSize(local_10);
  QString::~QString((QString *)0x132583);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(const QSizeF &size, QPageSize::Unit units) const
{
    if (!m_havePageSizes)
        loadPageSizes();

    // Try to find a supported page size based on fuzzy-matched unit size
    return supportedPageSizeMatch(QPageSize(size, units));
}